

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *fadexpr)

{
  double dVar1;
  uint ssize;
  double *pdVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  value_type vVar5;
  double dVar6;
  
  ssize = (((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
  }
  if (ssize != 0) {
    pdVar2 = (this->dx_).ptr_to_data;
    uVar3 = 0;
    if (0 < (int)ssize) {
      uVar3 = (ulong)ssize;
    }
    if ((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0) {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        vVar5 = FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>::dx
                          (&fadexpr->fadexpr_,(int)uVar4);
        pdVar2[uVar4] = vVar5;
      }
    }
    else {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        vVar5 = FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>::fastAccessDx
                          (&fadexpr->fadexpr_,(int)uVar4);
        pdVar2[uVar4] = vVar5;
      }
    }
  }
  dVar1 = (fadexpr->fadexpr_).left_.constant_;
  dVar6 = cos((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar6 * dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}